

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::DiffParser::ProcessLine(DiffParser *this)

{
  string *this_00;
  char cVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  DiffFieldType DVar5;
  long lVar6;
  byte *pbVar7;
  byte bVar8;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  if (*(this->super_LineParser).Line._M_dataplus._M_p == ':') {
    this->DiffField = DiffFieldChange;
    local_40 = 0;
    local_38 = 0;
    (this->CurChange).Action = '?';
    local_48 = &local_38;
    std::__cxx11::string::operator=((string *)&(this->CurChange).Path,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  DVar5 = this->DiffField;
  if (DVar5 == DiffFieldDst) {
LAB_0024ae7a:
    std::__cxx11::string::_M_assign((string *)&(this->CurChange).Path);
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
              (&this->Changes,&this->CurChange);
LAB_0024ae8f:
    DVar5 = DiffFieldNone;
  }
  else {
    if (DVar5 != DiffFieldSrc) {
      if (DVar5 != DiffFieldChange) {
        return true;
      }
      pcVar2 = (this->super_LineParser).Line._M_dataplus._M_p;
      DVar5 = DiffFieldNone;
      if ((*pcVar2 == ':') && (bVar8 = pcVar2[1], bVar8 != 0)) {
        pbVar7 = (byte *)(pcVar2 + 2);
        do {
          iVar4 = isspace((uint)bVar8);
          if (iVar4 != 0) goto LAB_0024ae2e;
          bVar8 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        } while (bVar8 != 0);
      }
      goto LAB_0024af0e;
    }
    cVar1 = (this->CurChange).Action;
    if (cVar1 == 'R') {
      (this->CurChange).Action = 'D';
      this_00 = &(this->CurChange).Path;
      std::__cxx11::string::_M_assign((string *)this_00);
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
                (&this->Changes,&this->CurChange);
      local_40 = 0;
      local_38 = 0;
      (this->CurChange).Action = 'A';
      local_48 = &local_38;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
      }
    }
    else {
      if (cVar1 != 'C') goto LAB_0024ae7a;
      (this->CurChange).Action = 'A';
    }
    DVar5 = DiffFieldDst;
  }
  goto LAB_0024af0e;
  while( true ) {
    bVar8 = *pbVar7;
    pbVar7 = pbVar7 + 1;
    if (bVar8 == 0) break;
LAB_0024ae2e:
    iVar4 = isspace((uint)bVar8);
    if (iVar4 == 0) goto LAB_0024ae4c;
  }
  goto LAB_0024af0e;
  while( true ) {
    bVar8 = *pbVar7;
    pbVar7 = pbVar7 + 1;
    if (bVar8 == 0) break;
LAB_0024ae4c:
    iVar4 = isspace((uint)bVar8);
    if (iVar4 != 0) goto LAB_0024ae9e;
  }
  goto LAB_0024af0e;
  while( true ) {
    bVar8 = *pbVar7;
    pbVar7 = pbVar7 + 1;
    if (bVar8 == 0) break;
LAB_0024ae9e:
    iVar4 = isspace((uint)bVar8);
    if (iVar4 == 0) goto LAB_0024af2b;
  }
  goto LAB_0024af0e;
  while( true ) {
    bVar8 = *pbVar7;
    pbVar7 = pbVar7 + 1;
    if (bVar8 == 0) break;
LAB_0024af2b:
    iVar4 = isspace((uint)bVar8);
    if (iVar4 != 0) goto LAB_0024af45;
  }
  goto LAB_0024af0e;
  while( true ) {
    bVar8 = *pbVar7;
    pbVar7 = pbVar7 + 1;
    if (bVar8 == 0) break;
LAB_0024af45:
    iVar4 = isspace((uint)bVar8);
    if (iVar4 == 0) goto LAB_0024af5f;
  }
  goto LAB_0024af0e;
  while( true ) {
    bVar8 = *pbVar7;
    pbVar7 = pbVar7 + 1;
    if (bVar8 == 0) break;
LAB_0024af5f:
    iVar4 = isspace((uint)bVar8);
    if (iVar4 != 0) goto LAB_0024af79;
  }
  goto LAB_0024af0e;
  while( true ) {
    bVar8 = *pbVar7;
    pbVar7 = pbVar7 + 1;
    if (bVar8 == 0) break;
LAB_0024af79:
    iVar4 = isspace((uint)bVar8);
    if (iVar4 == 0) {
      lVar6 = 0;
      bVar3 = bVar8;
      goto LAB_0024af8c;
    }
  }
  goto LAB_0024af0e;
  while( true ) {
    bVar3 = *pbVar7;
    lVar6 = lVar6 + -1;
    pbVar7 = pbVar7 + 1;
    if (bVar3 == 0) break;
LAB_0024af8c:
    iVar4 = isspace((uint)bVar3);
    if (iVar4 != 0) {
      if (lVar6 == 0) goto LAB_0024ae8f;
      break;
    }
  }
  (this->CurChange).Action = bVar8;
  DVar5 = DiffFieldSrc;
LAB_0024af0e:
  this->DiffField = DVar5;
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->Line[0] == ':') {
      this->DiffField = DiffFieldChange;
      this->CurChange = Change();
    }
    if (this->DiffField == DiffFieldChange) {
      // :src-mode dst-mode src-sha1 dst-sha1 status
      if (this->Line[0] != ':') {
        this->DiffField = DiffFieldNone;
        return true;
      }
      const char* src_mode_first = this->Line.c_str() + 1;
      const char* src_mode_last = this->ConsumeField(src_mode_first);
      const char* dst_mode_first = this->ConsumeSpace(src_mode_last);
      const char* dst_mode_last = this->ConsumeField(dst_mode_first);
      const char* src_sha1_first = this->ConsumeSpace(dst_mode_last);
      const char* src_sha1_last = this->ConsumeField(src_sha1_first);
      const char* dst_sha1_first = this->ConsumeSpace(src_sha1_last);
      const char* dst_sha1_last = this->ConsumeField(dst_sha1_first);
      const char* status_first = this->ConsumeSpace(dst_sha1_last);
      const char* status_last = this->ConsumeField(status_first);
      if (status_first != status_last) {
        this->CurChange.Action = *status_first;
        this->DiffField = DiffFieldSrc;
      } else {
        this->DiffField = DiffFieldNone;
      }
    } else if (this->DiffField == DiffFieldSrc) {
      // src-path
      if (this->CurChange.Action == 'C') {
        // Convert copy to addition of destination.
        this->CurChange.Action = 'A';
        this->DiffField = DiffFieldDst;
      } else if (this->CurChange.Action == 'R') {
        // Convert rename to deletion of source and addition of destination.
        this->CurChange.Action = 'D';
        this->CurChange.Path = this->Line;
        this->Changes.push_back(this->CurChange);

        this->CurChange = Change('A');
        this->DiffField = DiffFieldDst;
      } else {
        this->CurChange.Path = this->Line;
        this->Changes.push_back(this->CurChange);
        this->DiffField = this->DiffFieldNone;
      }
    } else if (this->DiffField == DiffFieldDst) {
      // dst-path
      this->CurChange.Path = this->Line;
      this->Changes.push_back(this->CurChange);
      this->DiffField = this->DiffFieldNone;
    }
    return true;
  }